

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaItemTypeToStr(xmlSchemaTypeType type)

{
  char *pcStack_10;
  xmlSchemaTypeType type_local;
  
  if (type == XML_SCHEMA_TYPE_BASIC) {
    pcStack_10 = "simple type definition";
  }
  else if (type == XML_SCHEMA_TYPE_ANY) {
    pcStack_10 = "wildcard (any)";
  }
  else if (type == XML_SCHEMA_TYPE_SIMPLE) {
    pcStack_10 = "simple type definition";
  }
  else if (type == XML_SCHEMA_TYPE_COMPLEX) {
    pcStack_10 = "complex type definition";
  }
  else if (type == XML_SCHEMA_TYPE_SEQUENCE) {
    pcStack_10 = "model group (sequence)";
  }
  else if (type == XML_SCHEMA_TYPE_CHOICE) {
    pcStack_10 = "model group (choice)";
  }
  else if (type == XML_SCHEMA_TYPE_ALL) {
    pcStack_10 = "model group (all)";
  }
  else if (type == XML_SCHEMA_TYPE_ELEMENT) {
    pcStack_10 = "element declaration";
  }
  else if (type == XML_SCHEMA_TYPE_ATTRIBUTE) {
    pcStack_10 = "attribute declaration";
  }
  else if (type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
    pcStack_10 = "attribute group definition";
  }
  else if (type == XML_SCHEMA_TYPE_GROUP) {
    pcStack_10 = "model group definition";
  }
  else if (type == XML_SCHEMA_TYPE_NOTATION) {
    pcStack_10 = "notation declaration";
  }
  else if (type == XML_SCHEMA_TYPE_IDC_UNIQUE) {
    pcStack_10 = "unique identity-constraint";
  }
  else if (type == XML_SCHEMA_TYPE_IDC_KEY) {
    pcStack_10 = "key identity-constraint";
  }
  else if (type == XML_SCHEMA_TYPE_IDC_KEYREF) {
    pcStack_10 = "keyref identity-constraint";
  }
  else if (type == XML_SCHEMA_TYPE_PARTICLE) {
    pcStack_10 = "particle";
  }
  else if (type == XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
    pcStack_10 = "attribute use";
  }
  else if (type == XML_SCHEMA_EXTRA_QNAMEREF) {
    pcStack_10 = "[helper component] QName reference";
  }
  else if (type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
    pcStack_10 = "[helper component] attribute use prohibition";
  }
  else {
    pcStack_10 = "Not a schema component";
  }
  return (xmlChar *)pcStack_10;
}

Assistant:

static const xmlChar *
xmlSchemaItemTypeToStr(xmlSchemaTypeType type)
{
    switch (type) {
	case XML_SCHEMA_TYPE_BASIC:
	    return(BAD_CAST "simple type definition");
	case XML_SCHEMA_TYPE_SIMPLE:
	    return(BAD_CAST "simple type definition");
	case XML_SCHEMA_TYPE_COMPLEX:
	    return(BAD_CAST "complex type definition");
	case XML_SCHEMA_TYPE_ELEMENT:
	    return(BAD_CAST "element declaration");
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    return(BAD_CAST "attribute use");
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return(BAD_CAST "attribute declaration");
	case XML_SCHEMA_TYPE_GROUP:
	    return(BAD_CAST "model group definition");
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return(BAD_CAST "attribute group definition");
	case XML_SCHEMA_TYPE_NOTATION:
	    return(BAD_CAST "notation declaration");
	case XML_SCHEMA_TYPE_SEQUENCE:
	    return(BAD_CAST "model group (sequence)");
	case XML_SCHEMA_TYPE_CHOICE:
	    return(BAD_CAST "model group (choice)");
	case XML_SCHEMA_TYPE_ALL:
	    return(BAD_CAST "model group (all)");
	case XML_SCHEMA_TYPE_PARTICLE:
	    return(BAD_CAST "particle");
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	    return(BAD_CAST "unique identity-constraint");
	    /* return(BAD_CAST "IDC (unique)"); */
	case XML_SCHEMA_TYPE_IDC_KEY:
	    return(BAD_CAST "key identity-constraint");
	    /* return(BAD_CAST "IDC (key)"); */
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return(BAD_CAST "keyref identity-constraint");
	    /* return(BAD_CAST "IDC (keyref)"); */
	case XML_SCHEMA_TYPE_ANY:
	    return(BAD_CAST "wildcard (any)");
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return(BAD_CAST "[helper component] QName reference");
	case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
	    return(BAD_CAST "[helper component] attribute use prohibition");
	default:
	    return(BAD_CAST "Not a schema component");
    }
}